

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv_tty_reset_mode(void)

{
  int iVar1;
  int *piVar2;
  int err;
  int local_4;
  
  iVar1 = uv_spinlock_trylock((uv_spinlock_t *)0x11c6ad);
  if (iVar1 == 0) {
    local_4 = -0x10;
  }
  else {
    local_4 = 0;
    if ((orig_termios_fd != -1) &&
       (iVar1 = tcsetattr(orig_termios_fd,0,(termios *)&orig_termios), iVar1 != 0)) {
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
    uv_spinlock_unlock(&termios_spinlock);
  }
  return local_4;
}

Assistant:

int uv_tty_reset_mode(void) {
  int err;

  if (!uv_spinlock_trylock(&termios_spinlock))
    return -EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    if (tcsetattr(orig_termios_fd, TCSANOW, &orig_termios))
      err = -errno;

  uv_spinlock_unlock(&termios_spinlock);
  return err;
}